

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * VmReserveMemObj(jx9_vm *pVm,sxu32 *pIndex)

{
  sxi32 sVar1;
  sxi32 rc;
  jx9_value *pObj;
  sxu32 *pIndex_local;
  jx9_vm *pVm_local;
  
  if (pIndex != (sxu32 *)0x0) {
    *pIndex = (pVm->aMemObj).nUsed;
  }
  sVar1 = SySetPut(&pVm->aMemObj,"");
  if (sVar1 == 0) {
    pVm_local = (jx9_vm *)SySetPeek(&pVm->aMemObj);
  }
  else {
    pVm_local = (jx9_vm *)0x0;
  }
  return (jx9_value *)pVm_local;
}

Assistant:

static jx9_value * VmReserveMemObj(jx9_vm *pVm, sxu32 *pIndex)
{
	jx9_value *pObj;
	sxi32 rc;
	if( pIndex ){
		/* Object index in the object table */
		*pIndex = SySetUsed(&pVm->aMemObj);
	}
	/* Reserve a slot for the new object */
	rc = SySetPut(&pVm->aMemObj, (const void *)zDummy);
	if( rc != SXRET_OK ){
		/* If the supplied memory subsystem is so sick that we are unable to allocate
		 * a tiny chunk of memory, there is no much we can do here.
		 */
		return 0;
	}
	pObj = (jx9_value *)SySetPeek(&pVm->aMemObj);
	return pObj;
}